

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

SoapySDRRange *
SoapySDRDevice_getFrequencyRange(SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  SoapySDRRange *pSVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  void *local_48;
  void *local_40;
  
  *length = 0;
  puVar5 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar5 = 0;
  *(undefined4 *)(puVar5 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x1e0))(&local_48,device,direction,channel);
  pSVar6 = callocArrayType<SoapySDRRange>
                     (((long)local_40 - (long)local_48 >> 3) * -0x5555555555555555);
  sVar7 = ((long)local_40 - (long)local_48 >> 3) * -0x5555555555555555;
  if (local_40 == local_48) {
    *length = sVar7;
    if (local_40 == (void *)0x0) {
      return pSVar6;
    }
  }
  else {
    lVar8 = sVar7 + (sVar7 == 0);
    lVar9 = 0x10;
    do {
      uVar3 = *(undefined8 *)((long)local_48 + lVar9);
      puVar1 = (undefined8 *)((long)local_48 + lVar9 + -0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pSVar6 + lVar9 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&pSVar6->minimum + lVar9) = uVar3;
      lVar9 = lVar9 + 0x18;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    *length = sVar7;
  }
  operator_delete(local_48);
  return pSVar6;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getFrequencyRange(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getFrequencyRange(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}